

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

boolean equip_is_worn(obj *otmp)

{
  byte bVar1;
  
  if ((((((uright != otmp) && (uleft != otmp)) && (uamul != otmp)) &&
       ((uarms != otmp && (uarmg != otmp)))) &&
      ((uarmh != otmp && ((uarmf != otmp && (uarmc != otmp)))))) &&
     ((uarmu != otmp && (uarm != otmp)))) {
    return '\0';
  }
  bVar1 = donning_on(otmp);
  return bVar1 ^ 1;
}

Assistant:

boolean equip_is_worn(const struct obj *otmp)
{
	boolean worn = FALSE;

	if (otmp == uarm) worn = TRUE;
	if (otmp == uarmu) worn = TRUE;
	if (otmp == uarmc) worn = TRUE;
	if (otmp == uarmf) worn = TRUE;
	if (otmp == uarmh) worn = TRUE;
	if (otmp == uarmg) worn = TRUE;
	if (otmp == uarms) worn = TRUE;

	if (otmp == uamul) worn = TRUE;
	if (otmp == uleft) worn = TRUE;
	if (otmp == uright) worn = TRUE;

	/*
	 * Beware: Gives a false positive between cancel_don() and Foo_off().
	 * See caveat in donning_on() for details.
	 */
	return !!(worn && !donning_on(otmp));
}